

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O1

void __thiscall
TApp_IniNotRequiredNotDefault_Test::TestBody(TApp_IniNotRequiredNotDefault_Test *this)

{
  App *this_00;
  undefined1 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  int three;
  int two;
  int one;
  TempFile tmpini2;
  TempFile tmpini;
  ofstream out;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  AssertHelper local_3e0;
  int local_3d4 [3];
  TempFile local_3c8;
  TempFile local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  undefined1 *local_228;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [184];
  ios_base local_130 [264];
  
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"TestIniTmp.ini","");
  TempFile::TempFile(&local_3a8,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"TestIniTmp2.ini","");
  TempFile::TempFile(&local_3c8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"--config","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,local_3a8._name._M_dataplus._M_p,
             local_3a8._name._M_dataplus._M_p + local_3a8._name._M_string_length);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"Read an ini file","");
  this_00 = &(this->super_TApp).app;
  CLI::App::set_config(this_00,&local_288,&local_2a8,&local_2c8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  std::ofstream::ofstream(&local_228,(string *)&local_3a8,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"[default]",9);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"two=99",6);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"three=3",7);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  uVar2 = ___throw_bad_array_new_length;
  puVar1 = _VTT;
  local_228 = _VTT;
  *(undefined8 *)((long)&local_228 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_220);
  std::ios_base::~ios_base(local_130);
  std::ofstream::ofstream(&local_228,(string *)&local_3c8,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"[default]",9);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"two=98",6);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"three=4",7);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  local_228 = puVar1;
  *(undefined8 *)((long)&local_228 + *(long *)(puVar1 + -0x18)) = uVar2;
  std::filebuf::~filebuf((filebuf *)&local_220);
  std::ios_base::~ios_base(local_130);
  local_3d4[2] = 0;
  local_3d4[1] = 0;
  local_3d4[0] = 0;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"--one","");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_2e8,local_3d4 + 2,&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"--two","");
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_328,local_3d4 + 1,&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"--three","");
  pcVar4 = "";
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"","");
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_368,local_3d4,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  TApp::run(&this->super_TApp);
  local_3e8.ptr_._0_4_ = 99;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_228,"99","two",(int *)&local_3e8,local_3d4 + 1);
  if (local_228._0_1_ == (ostream)0x0) {
    testing::Message::Message((Message *)&local_3e8);
    if (local_220.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_220.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xe2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    if (local_3e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_3e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3e8.ptr_ + 8))();
      }
      local_3e8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3e8.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_228,"3","three",(int *)&local_3e8,local_3d4);
  if (local_228._0_1_ == (ostream)0x0) {
    testing::Message::Message((Message *)&local_3e8);
    if (local_220.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_220.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xe3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    if (local_3e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_3e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3e8.ptr_ + 8))();
      }
      local_3e8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(this_00);
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"--config","");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,local_3c8._name._M_dataplus._M_p,
             local_3c8._name._M_dataplus._M_p + local_3c8._name._M_string_length);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&local_228,local_1e8);
  lVar5 = 0;
  do {
    if (local_1f8 + lVar5 != *(undefined1 **)((long)local_208 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_208 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  TApp::run(&this->super_TApp);
  local_3e8.ptr_._0_4_ = 0x62;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_228,"98","two",(int *)&local_3e8,local_3d4 + 1);
  if (local_228._0_1_ == (ostream)0x0) {
    testing::Message::Message((Message *)&local_3e8);
    if (local_220.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_220.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xe9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    if (local_3e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_3e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3e8.ptr_ + 8))();
      }
      local_3e8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3e8.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_228,"4","three",(int *)&local_3e8,local_3d4);
  if (local_228._0_1_ == (ostream)0x0) {
    testing::Message::Message((Message *)&local_3e8);
    if (local_220.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_220.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xea,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    if (local_3e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_3e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3e8.ptr_ + 8))();
      }
      local_3e8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  remove(local_3c8._name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._name._M_dataplus._M_p != &local_3c8._name.field_2) {
    operator_delete(local_3c8._name._M_dataplus._M_p);
  }
  remove(local_3a8._name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._name._M_dataplus._M_p != &local_3a8._name.field_2) {
    operator_delete(local_3a8._name._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, IniNotRequiredNotDefault) {

    TempFile tmpini{"TestIniTmp.ini"};
    TempFile tmpini2{"TestIniTmp2.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "two=99" << std::endl;
        out << "three=3" << std::endl;
    }

    {
        std::ofstream out{tmpini2};
        out << "[default]" << std::endl;
        out << "two=98" << std::endl;
        out << "three=4" << std::endl;
    }

    int one = 0, two = 0, three = 0;
    app.add_option("--one", one);
    app.add_option("--two", two);
    app.add_option("--three", three);

    run();

    EXPECT_EQ(99, two);
    EXPECT_EQ(3, three);

    app.reset();
    args = {"--config", tmpini2};
    run();

    EXPECT_EQ(98, two);
    EXPECT_EQ(4, three);
}